

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O3

compile_errcode __thiscall Expression::Generate(Expression *this,string *expression_string)

{
  SymbolName SVar1;
  int iVar2;
  PcodeType op;
  Term *this_00;
  string term_string1;
  string term_string2;
  string temp;
  string add_identity;
  Pcode pcode;
  string local_200;
  string local_1e0;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  string *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  _Alloc_hider local_d0;
  undefined1 local_c8 [8];
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Alloc_hider local_90;
  char local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  string local_50;
  
  local_f8 = local_e8;
  local_1a0 = expression_string;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"0","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_200,local_f8,local_f8 + local_f0);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  op = ADD;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1c0 = local_1b0;
  local_1b8 = 0;
  local_1b0[0] = 0;
  this_00 = &this->m_term;
  iVar2 = 0;
  do {
    while( true ) {
      SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
      if (iVar2 == 0) break;
      if (iVar2 == 2) {
        Term::Generate(this_00,&local_1e0);
        PcodeGenerator::GetNextTemp_abi_cxx11_((string *)&local_d8,pcode_generator);
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_d8);
        if (local_d8 != local_c8) {
          operator_delete(local_d8);
        }
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_1c0,local_1c0 + local_1b8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_200._M_dataplus._M_p,
                   local_200._M_dataplus._M_p + local_200._M_string_length);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_1e0._M_dataplus._M_p,
                   local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
        Pcode::Pcode((Pcode *)&local_d8,op,&local_178,&local_198,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        std::vector<Pcode,_std::allocator<Pcode>_>::push_back
                  (&pcode_generator->m_pcode_queue,(Pcode *)&local_d8);
        std::__cxx11::string::_M_assign((string *)&local_200);
        if (local_70._M_p != local_60) {
          operator_delete(local_70._M_p);
        }
        if (local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if (local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p);
        }
        if (local_d0._M_p != local_c0) {
          operator_delete(local_d0._M_p);
        }
LAB_001483d9:
        iVar2 = 1;
      }
      else {
        if (1 < SVar1 - ADD_SYM) {
          std::__cxx11::string::_M_assign((string *)local_1a0);
          if (local_1c0 != local_1b0) {
            operator_delete(local_1c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          if (local_f8 != local_e8) {
            operator_delete(local_f8);
          }
          return 0;
        }
        op = (PcodeType)(SVar1 != ADD_SYM);
        iVar2 = 2;
LAB_00148430:
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
    }
    if (SVar1 - ADD_SYM < 2) {
      if (SVar1 == SUB_SYM) {
        op = SUB;
      }
      iVar2 = 0;
      goto LAB_00148430;
    }
    if (op == SUB) {
      Term::Generate(this_00,&local_1e0);
      PcodeGenerator::GetNextTemp_abi_cxx11_((string *)&local_d8,pcode_generator);
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_d8);
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_1c0,local_1c0 + local_1b8);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_200._M_dataplus._M_p,
                 local_200._M_dataplus._M_p + local_200._M_string_length);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_1e0._M_dataplus._M_p,
                 local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
      Pcode::Pcode((Pcode *)&local_d8,SUB,&local_138,&local_158,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      std::vector<Pcode,_std::allocator<Pcode>_>::push_back
                (&pcode_generator->m_pcode_queue,(Pcode *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&local_200);
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      if (local_90._M_p != local_80) {
        operator_delete(local_90._M_p);
      }
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      if (local_d0._M_p != local_c0) {
        operator_delete(local_d0._M_p);
      }
      op = SUB;
      goto LAB_001483d9;
    }
    iVar2 = 1;
    Term::Generate(this_00,&local_200);
  } while( true );
}

Assistant:

compile_errcode Expression::Generate(string& expression_string) {
    int ret = COMPILE_OK;
    int state = 0;
    string add_identity("0");
    string term_string1 = add_identity;
    string term_string2;
    string temp;
    PcodeType pcode_type = ADD;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsAddOperation(name)) {
                    if (name == SUB_SYM) {
                        pcode_type = SUB;
                    }
                    state = 0;
                    break;
                } else {
                    if (pcode_type == SUB) {
                        m_term.Generate(term_string2);
                        temp = pcode_generator->GetNextTemp();
                        Pcode pcode(SUB, temp, term_string1, term_string2);
                        pcode_generator->Insert(pcode);
                        term_string1 = temp;
                    } else {
                        m_term.Generate(term_string1);
                    }
                    state = 1;
                    break;
                }
            }
            case 1: {
                if (IsAddOperation(name)) {
                    if (name == ADD_SYM) {
                        pcode_type = ADD;
                    } else {
                        pcode_type = SUB;
                    }
                    state = 2;
                    break;
                } else {
                    expression_string = term_string1;
                    return COMPILE_OK;
                }
            }
            case 2: {
                m_term.Generate(term_string2);
                temp = pcode_generator->GetNextTemp();
                Pcode pcode(pcode_type, temp, term_string1, term_string2);
                pcode_generator->Insert(pcode);
                term_string1 = temp;
                state = 1;
            }
        }
        if (state != 1) {
            handle_correct_queue->NextSymbol();
        }
    }
}